

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::lookingAtSpecialString(SelectionCompiler *this)

{
  char cVar1;
  char *pcVar2;
  long in_RDI;
  bool bVar3;
  char ch;
  int ichT;
  undefined4 local_c;
  
  local_c = *(int *)(in_RDI + 0xd8);
  pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
  cVar1 = *pcVar2;
  while( true ) {
    bVar3 = false;
    if (((local_c < *(int *)(in_RDI + 0xd0)) && (bVar3 = false, cVar1 != ';')) &&
       (bVar3 = false, cVar1 != '\r')) {
      bVar3 = cVar1 != '\n';
    }
    if (!bVar3) break;
    local_c = local_c + 1;
  }
  *(int *)(in_RDI + 0xdc) = local_c - *(int *)(in_RDI + 0xd8);
  return 0 < *(int *)(in_RDI + 0xdc);
}

Assistant:

bool SelectionCompiler::lookingAtSpecialString() {
    int ichT = ichToken;
    char ch  = script[ichT];
    while (ichT < cchScript && ch != ';' && ch != '\r' && ch != '\n') {
      ++ichT;
    }
    cchToken = ichT - ichToken;
    return cchToken > 0;
  }